

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uint uVar1;
  undefined4 uVar2;
  void *pvVar3;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  void *in_R9;
  uint testsize;
  LodePNGCompressSettings zlibsettings;
  uchar *dummy;
  uint bestType_2;
  uint type_3;
  size_t smallest_2;
  uchar *attempt_2 [5];
  size_t size [5];
  uchar type_2;
  size_t inindex_1;
  size_t outindex_1;
  float p;
  uint count [256];
  uint bestType_1;
  uint type_1;
  float smallest_1;
  uchar *attempt_1 [5];
  float sum_1 [5];
  uchar s;
  uchar bestType;
  uchar type;
  size_t smallest;
  uchar *attempt [5];
  size_t sum [5];
  size_t inindex;
  size_t outindex;
  LodePNGFilterStrategy strategy;
  uint error;
  uint y;
  uint x;
  uchar *prevline;
  size_t bytewidth;
  size_t linebytes;
  uint bpp;
  undefined4 in_stack_fffffffffffff9f8;
  float fVar4;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffa14;
  uchar **in_stack_fffffffffffffa18;
  uchar *in_stack_fffffffffffffa20;
  uchar *in_stack_fffffffffffffa28;
  uchar *scanline;
  uchar *in_stack_fffffffffffffa30;
  uchar *out_00;
  uint local_5b8;
  uint local_5b4;
  ulong local_5b0;
  long alStack_5a8 [6];
  ulong local_578 [6];
  undefined1 local_541;
  long local_540;
  long local_538;
  float local_52c;
  uint auStack_528 [257];
  uint local_124;
  uint local_120;
  float local_11c;
  long alStack_118 [6];
  float afStack_e8 [5];
  byte local_d3;
  byte local_d2;
  byte local_d1;
  ulong local_d0;
  long alStack_c8 [6];
  ulong auStack_98 [5];
  long local_70;
  long local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  uint local_34;
  void *local_30;
  int *local_28;
  uint local_20;
  int local_1c;
  long local_18;
  long local_10;
  uint local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = lodepng_get_bpp((LodePNGColorMode *)0x128df2);
  local_40 = (ulong)(local_1c * local_34 + 7 >> 3);
  local_48 = (ulong)(local_34 + 7 >> 3);
  local_50 = 0;
  local_5c = 0;
  local_60 = *(int *)((long)local_30 + 0x38);
  if ((*(int *)((long)local_30 + 0x34) != 0) && ((*local_28 == 3 || ((uint)local_28[1] < 8)))) {
    local_60 = 0;
  }
  if (local_34 == 0) {
    local_4 = 0x1f;
  }
  else {
    if (local_60 == 0) {
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        local_68 = (local_40 + 1) * (ulong)local_58;
        local_70 = local_40 * local_58;
        *(undefined1 *)(local_10 + local_68) = 0;
        filterScanline(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20
                       ,(size_t)in_stack_fffffffffffffa18,
                       CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                       (uchar)((uint)in_stack_fffffffffffffa0c >> 0x18));
        local_50 = local_18 + local_70;
      }
    }
    else if (local_60 == 1) {
      local_d0 = 0;
      local_d2 = 0;
      for (local_d1 = 0; local_d1 != 5; local_d1 = local_d1 + 1) {
        pvVar3 = lodepng_malloc(0x128fdf);
        alStack_c8[local_d1] = (long)pvVar3;
        if (alStack_c8[local_d1] == 0) {
          return 0x53;
        }
      }
      if (local_5c == 0) {
        for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
          for (local_d1 = 0; local_d1 != 5; local_d1 = local_d1 + 1) {
            filterScanline(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                           in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18,
                           CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                           (uchar)((uint)in_stack_fffffffffffffa0c >> 0x18));
            auStack_98[local_d1] = 0;
            if (local_d1 == 0) {
              for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                auStack_98[0] = *(byte *)(alStack_c8[0] + (ulong)local_54) + auStack_98[0];
              }
            }
            else {
              for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                local_d3 = *(byte *)(alStack_c8[local_d1] + (ulong)local_54);
                if (local_d3 < 0x80) {
                  uVar1 = (uint)local_d3;
                }
                else {
                  uVar1 = 0xff - local_d3;
                }
                auStack_98[local_d1] = (ulong)uVar1 + auStack_98[local_d1];
              }
            }
            if ((local_d1 == 0) || (auStack_98[local_d1] < local_d0)) {
              local_d2 = local_d1;
              local_d0 = auStack_98[local_d1];
            }
          }
          local_50 = local_18 + local_58 * local_40;
          *(byte *)(local_10 + (ulong)local_58 * (local_40 + 1)) = local_d2;
          for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
            *(undefined1 *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
                 *(undefined1 *)(alStack_c8[local_d2] + (ulong)local_54);
          }
        }
      }
      for (local_d1 = '\0'; local_d1 != '\x05'; local_d1 = local_d1 + '\x01') {
        lodepng_free((void *)0x129360);
      }
    }
    else if (local_60 == 2) {
      local_11c = 0.0;
      local_124 = 0;
      for (local_120 = 0; local_120 != 5; local_120 = local_120 + 1) {
        pvVar3 = lodepng_malloc(0x1293be);
        alStack_118[local_120] = (long)pvVar3;
        if (alStack_118[local_120] == 0) {
          return 0x53;
        }
      }
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        for (local_120 = 0; local_120 != 5; local_120 = local_120 + 1) {
          filterScanline(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                         in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18,
                         CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                         (uchar)((uint)in_stack_fffffffffffffa0c >> 0x18));
          for (local_54 = 0; local_54 != 0x100; local_54 = local_54 + 1) {
            auStack_528[local_54] = 0;
          }
          for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
            auStack_528[*(byte *)(alStack_118[local_120] + (ulong)local_54)] =
                 auStack_528[*(byte *)(alStack_118[local_120] + (ulong)local_54)] + 1;
          }
          auStack_528[local_120] = auStack_528[local_120] + 1;
          afStack_e8[local_120] = 0.0;
          for (local_54 = 0; local_54 != 0x100; local_54 = local_54 + 1) {
            local_52c = (float)auStack_528[local_54] / (float)(local_40 + 1);
            if (auStack_528[local_54] == 0) {
              fVar4 = 0.0;
            }
            else {
              fVar4 = flog2(1.0 / local_52c);
              fVar4 = fVar4 * local_52c;
            }
            afStack_e8[local_120] = fVar4 + afStack_e8[local_120];
          }
          if ((local_120 == 0) || (afStack_e8[local_120] < local_11c)) {
            local_124 = local_120;
            local_11c = afStack_e8[local_120];
          }
        }
        local_50 = local_18 + local_58 * local_40;
        *(char *)(local_10 + (ulong)local_58 * (local_40 + 1)) = (char)local_124;
        for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
          *(undefined1 *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
               *(undefined1 *)(alStack_118[local_124] + (ulong)local_54);
        }
      }
      for (local_120 = 0; local_120 != 5; local_120 = local_120 + 1) {
        lodepng_free((void *)0x1297c6);
      }
    }
    else if (local_60 == 4) {
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        local_538 = (local_40 + 1) * (ulong)local_58;
        local_540 = local_40 * local_58;
        local_541 = *(undefined1 *)(*(long *)((long)local_30 + 0x40) + (ulong)local_58);
        *(undefined1 *)(local_10 + local_538) = local_541;
        filterScanline(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20
                       ,(size_t)in_stack_fffffffffffffa18,
                       CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                       (uchar)((uint)in_stack_fffffffffffffa0c >> 0x18));
        local_50 = local_18 + local_540;
      }
    }
    else {
      if (local_60 != 3) {
        return 0x58;
      }
      local_5b0 = 0;
      local_5b8 = 0;
      memcpy(&stack0xfffffffffffffa10,local_30,0x30);
      uVar5 = 1;
      scanline = (uchar *)0x0;
      out_00 = (uchar *)0x0;
      for (local_5b4 = 0; local_5b4 != 5; local_5b4 = local_5b4 + 1) {
        pvVar3 = lodepng_malloc(0x129970);
        alStack_5a8[local_5b4] = (long)pvVar3;
        if (alStack_5a8[local_5b4] == 0) {
          return 0x53;
        }
      }
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        for (local_5b4 = 0; local_5b4 != 5; local_5b4 = local_5b4 + 1) {
          uVar2 = (undefined4)local_40;
          filterScanline(out_00,scanline,in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18
                         ,CONCAT44(in_stack_fffffffffffffa14,uVar5),(uchar)(local_40 >> 0x18));
          local_578[local_5b4] = 0;
          zlib_compress(in_stack_fffffffffffffa18,
                        (size_t *)CONCAT44(in_stack_fffffffffffffa14,uVar5),
                        (uchar *)CONCAT44(uVar2,in_stack_fffffffffffffa08),
                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                        (LodePNGCompressSettings *)
                        CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          lodepng_free((void *)0x129a82);
          if ((local_5b4 == 0) || (local_578[local_5b4] < local_5b0)) {
            local_5b8 = local_5b4;
            local_5b0 = local_578[local_5b4];
          }
        }
        local_50 = local_18 + local_58 * local_40;
        *(char *)(local_10 + (ulong)local_58 * (local_40 + 1)) = (char)local_5b8;
        for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
          *(undefined1 *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
               *(undefined1 *)(alStack_5a8[local_5b8] + (ulong)local_54);
        }
      }
      for (local_5b4 = 0; local_5b4 != 5; local_5b4 = local_5b4 + 1) {
        lodepng_free((void *)0x129bb9);
      }
    }
    local_4 = local_5c;
  }
  return local_4;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
	const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
	/*
	For PNG filter method 0
	out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
	the scanlines with 1 extra byte per scanline
	*/

	unsigned bpp = lodepng_get_bpp(info);
	/*the width of a scanline in bytes, not including the filter type*/
	size_t linebytes = (w * bpp + 7) / 8;
	/*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
	size_t bytewidth = (bpp + 7) / 8;
	const unsigned char* prevline = 0;
	unsigned x, y;
	unsigned error = 0;
	LodePNGFilterStrategy strategy = settings->filter_strategy;

	/*
	There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
	 *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
		 use fixed filtering, with the filter None).
	 * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
		not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
		all five filters and select the filter that produces the smallest sum of absolute values per row.
	This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

	If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
	but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
	heuristic is used.
	*/
	if (settings->filter_palette_zero &&
		(info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

	if (bpp == 0) return 31; /*error: invalid color type*/

	if (strategy == LFS_ZERO)
	{
		for (y = 0; y != h; ++y)
		{
			size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
			size_t inindex = linebytes * y;
			out[outindex] = 0; /*filter type byte*/
			filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
			prevline = &in[inindex];
		}
	}
	else if (strategy == LFS_MINSUM)
	{
		/*adaptive filtering*/
		size_t sum[5];
		unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
		size_t smallest = 0;
		unsigned char type, bestType = 0;

		for (type = 0; type != 5; ++type)
		{
			attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
			if (!attempt[type]) return 83; /*alloc fail*/
		}

		if (!error)
		{
			for (y = 0; y != h; ++y)
			{
				/*try the 5 filter types*/
				for (type = 0; type != 5; ++type)
				{
					filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

					/*calculate the sum of the result*/
					sum[type] = 0;
					if (type == 0)
					{
						for (x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
					}
					else
					{
						for (x = 0; x != linebytes; ++x)
						{
							/*For differences, each byte should be treated as signed, values above 127 are negative
							(converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
							This means filtertype 0 is almost never chosen, but that is justified.*/
							unsigned char s = attempt[type][x];
							sum[type] += s < 128 ? s : (255U - s);
						}
					}

					/*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
					if (type == 0 || sum[type] < smallest)
					{
						bestType = type;
						smallest = sum[type];
					}
				}

				prevline = &in[y * linebytes];

				/*now fill the out values*/
				out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
				for (x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
			}
		}

		for (type = 0; type != 5; ++type) lodepng_free(attempt[type]);
	}
	else if (strategy == LFS_ENTROPY)
	{
		float sum[5];
		unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
		float smallest = 0;
		unsigned type, bestType = 0;
		unsigned count[256];

		for (type = 0; type != 5; ++type)
		{
			attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
			if (!attempt[type]) return 83; /*alloc fail*/
		}

		for (y = 0; y != h; ++y)
		{
			/*try the 5 filter types*/
			for (type = 0; type != 5; ++type)
			{
				filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
				for (x = 0; x != 256; ++x) count[x] = 0;
				for (x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
				++count[type]; /*the filter type itself is part of the scanline*/
				sum[type] = 0;
				for (x = 0; x != 256; ++x)
				{
					float p = count[x] / (float)(linebytes + 1);
					sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
				}
				/*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
				if (type == 0 || sum[type] < smallest)
				{
					bestType = type;
					smallest = sum[type];
				}
			}

			prevline = &in[y * linebytes];

			/*now fill the out values*/
			out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
			for (x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
		}

		for (type = 0; type != 5; ++type) lodepng_free(attempt[type]);
	}
	else if (strategy == LFS_PREDEFINED)
	{
		for (y = 0; y != h; ++y)
		{
			size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
			size_t inindex = linebytes * y;
			unsigned char type = settings->predefined_filters[y];
			out[outindex] = type; /*filter type byte*/
			filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
			prevline = &in[inindex];
		}
	}
	else if (strategy == LFS_BRUTE_FORCE)
	{
		/*brute force filter chooser.
		deflate the scanline after every filter attempt to see which one deflates best.
		This is very slow and gives only slightly smaller, sometimes even larger, result*/
		size_t size[5];
		unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
		size_t smallest = 0;
		unsigned type = 0, bestType = 0;
		unsigned char* dummy;
		LodePNGCompressSettings zlibsettings = settings->zlibsettings;
		/*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
		to simulate the true case where the tree is the same for the whole image. Sometimes it gives
		better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
		cases better compression. It does make this a bit less slow, so it's worth doing this.*/
		zlibsettings.btype = 1;
		/*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
		images only, so disable it*/
		zlibsettings.custom_zlib = 0;
		zlibsettings.custom_deflate = 0;
		for (type = 0; type != 5; ++type)
		{
			attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
			if (!attempt[type]) return 83; /*alloc fail*/
		}
		for (y = 0; y != h; ++y) /*try the 5 filter types*/
		{
			for (type = 0; type != 5; ++type)
			{
				unsigned testsize = linebytes;
				/*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

				filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
				size[type] = 0;
				dummy = 0;
				zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
				lodepng_free(dummy);
				/*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
				if (type == 0 || size[type] < smallest)
				{
					bestType = type;
					smallest = size[type];
				}
			}
			prevline = &in[y * linebytes];
			out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
			for (x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
		}
		for (type = 0; type != 5; ++type) lodepng_free(attempt[type]);
	}
	else return 88; /* unknown filter strategy */

	return error;
}